

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcpyfldin_s.c
# Opt level: O2

errno_t strcpyfldin_s(char *dest,rsize_t dmax,char *src,rsize_t slen)

{
  char cVar1;
  long lVar2;
  rsize_t rVar3;
  errno_t error;
  rsize_t rVar4;
  errno_t eVar5;
  char *pcVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (dest == (char *)0x0) {
    pcVar6 = "strcpyfldin_s: dest is null";
LAB_00104b4e:
    eVar5 = 400;
    error = 400;
  }
  else if (dmax == 0) {
    pcVar6 = "strcpyfldin_s: dmax is 0";
LAB_00104b63:
    eVar5 = 0x191;
    error = 0x191;
  }
  else {
    if (dmax < 0x10000001) {
      if (src == (char *)0x0) {
        for (rVar3 = 0; dmax != rVar3; rVar3 = rVar3 + 1) {
          dest[rVar3] = '\0';
        }
        pcVar6 = "strcpyfldin_s: src is null";
        goto LAB_00104b4e;
      }
      if (slen == 0) {
        for (rVar3 = 0; dmax != rVar3; rVar3 = rVar3 + 1) {
          dest[rVar3] = '\0';
        }
        pcVar6 = "strcpyfldin_s: slen is 0";
        goto LAB_00104b63;
      }
      if (slen <= dmax) {
        pcVar6 = dest;
        pcVar7 = src;
        rVar3 = dmax;
        if (src <= dest) {
LAB_00104c28:
          if (rVar3 != 0) {
            cVar1 = *src;
            if (cVar1 != '\0') {
              if (src != dest) goto code_r0x00104c3b;
              for (rVar3 = 0; dmax != rVar3; rVar3 = rVar3 + 1) {
                dest[rVar3] = '\0';
              }
              goto LAB_00104c81;
            }
            goto LAB_00104c4b;
          }
          goto LAB_00104c49;
        }
LAB_00104bf2:
        if (rVar3 == 0) {
LAB_00104c49:
          rVar3 = 0;
        }
        else if (*pcVar7 != '\0') {
          if (pcVar6 != src) goto code_r0x00104c05;
          for (rVar3 = 0; dmax != rVar3; rVar3 = rVar3 + 1) {
            dest[rVar3] = '\0';
          }
LAB_00104c81:
          pcVar6 = "strcpyfldin_s: overlapping objects";
          eVar5 = 0x194;
          error = 0x194;
          goto LAB_00104b6f;
        }
LAB_00104c4b:
        eVar5 = 0;
        for (rVar4 = 0; rVar3 != rVar4; rVar4 = rVar4 + 1) {
          pcVar6[rVar4] = '\0';
        }
        goto LAB_00104b74;
      }
      for (rVar3 = 0; dmax != rVar3; rVar3 = rVar3 + 1) {
        dest[rVar3] = '\0';
      }
      pcVar6 = "strcpyfldin_s: slen exceeds max";
    }
    else {
      pcVar6 = "strcpyfldin_s: dmax exceeds max";
    }
    eVar5 = 0x193;
    error = 0x193;
  }
LAB_00104b6f:
  invoke_safe_str_constraint_handler(pcVar6,(void *)0x0,error);
LAB_00104b74:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return eVar5;
code_r0x00104c3b:
  src = src + 1;
  *pcVar6 = cVar1;
  pcVar6 = pcVar6 + 1;
  rVar3 = rVar3 - 1;
  goto LAB_00104c28;
code_r0x00104c05:
  *pcVar6 = *pcVar7;
  pcVar6 = pcVar6 + 1;
  pcVar7 = pcVar7 + 1;
  rVar3 = rVar3 - 1;
  goto LAB_00104bf2;
}

Assistant:

errno_t
strcpyfldin_s (char *dest, rsize_t dmax, const char *src, rsize_t slen)
{
    rsize_t orig_dmax;
    char *orig_dest;
    const char *overlap_bumper;

    if (dest == NULL) {
        invoke_safe_str_constraint_handler("strcpyfldin_s: dest is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (dmax == 0) {
        invoke_safe_str_constraint_handler("strcpyfldin_s: dmax is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (dmax > RSIZE_MAX_STR) {
        invoke_safe_str_constraint_handler("strcpyfldin_s: dmax exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }

    if (src == NULL) {
        /* null string to clear data */
        while (dmax) {  *dest = '\0'; dmax--; dest++; }

        invoke_safe_str_constraint_handler("strcpyfldin_s: src is null",
                   NULL, ESNULLP);
        return (ESNULLP);
    }

    if (slen == 0) {
        /* null string to clear data */
        while (dmax) {  *dest = '\0'; dmax--; dest++; }

        invoke_safe_str_constraint_handler("strcpyfldin_s: slen is 0",
                   NULL, ESZEROL);
        return (ESZEROL);
    }

    if (slen > dmax) {
        /* null string to clear data */
        while (dmax) {  *dest = '\0'; dmax--; dest++; }

        invoke_safe_str_constraint_handler("strcpyfldin_s: slen exceeds max",
                   NULL, ESLEMAX);
        return (ESLEMAX);
    }


    /* hold base of dest in case src was not copied */
    orig_dmax = dmax;
    orig_dest = dest;

    if (dest < src) {
        overlap_bumper = src;

        while (dmax > 0 && *src) {

            if (dest == overlap_bumper) {
                dmax = orig_dmax;
                dest = orig_dest;

                /* null string to eliminate partial copy */
                while (dmax) { *dest = '\0'; dmax--; dest++; }

                invoke_safe_str_constraint_handler(
                          "strcpyfldin_s: overlapping objects",
                           NULL, ESOVRLP);
                return (ESOVRLP);
            }

            dmax--;
            *dest++ = *src++;
        }

    } else {
        overlap_bumper = dest;

        while (dmax > 0 && *src) {

            if (src == overlap_bumper) {
                dmax = orig_dmax;
                dest = orig_dest;

                /* null string to eliminate partial copy */
                while (dmax) { *dest = '\0'; dmax--; dest++; }

                invoke_safe_str_constraint_handler(
                          "strcpyfldin_s: overlapping objects",
                           NULL, ESOVRLP);
                return (ESOVRLP);
            }

            dmax--;
            *dest++ = *src++;
        }
    }

    /*
     * finish filling in the field with nulls if there is slack space
     */
    while (dmax) { *dest = '\0'; dmax--; dest++; }

    return (EOK);
}